

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny-format.hh
# Opt level: O3

ostringstream *
tinyusdz::fmt::detail::format_sv_rec<unsigned_long,int>
          (ostringstream *ss,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sv,size_t idx,unsigned_long *v,int *args)

{
  int iVar1;
  pointer pbVar2;
  long lVar3;
  
  pbVar2 = (sv->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (idx < (ulong)((long)(sv->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
    lVar3 = idx << 5;
    do {
      iVar1 = ::std::__cxx11::string::compare((char *)((long)&(pbVar2->_M_dataplus)._M_p + lVar3));
      if (iVar1 == 0) {
        ::std::ostream::_M_insert<unsigned_long>((ulong)ss);
        format_sv_rec<int>(ss,sv,idx + 1,args);
        return ss;
      }
      pbVar2 = (sv->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ss,*(char **)((long)&(pbVar2->_M_dataplus)._M_p + lVar3),
                 *(long *)((long)&pbVar2->_M_string_length + lVar3));
      idx = idx + 1;
      pbVar2 = (sv->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x20;
    } while (idx < (ulong)((long)(sv->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5));
  }
  return ss;
}

Assistant:

std::ostringstream &format_sv_rec(std::ostringstream &ss,
                                  const std::vector<std::string> &sv,
                                  size_t idx, T const &v, Rest const &...args) {
  if (idx >= sv.size()) {
    return ss;
  }

  if (sv[idx] == "{}") {
    ss << v;
    format_sv_rec(ss, sv, idx + 1, args...);
  } else {
    ss << sv[idx];
    format_sv_rec(ss, sv, idx + 1, v, args...);
  }

  return ss;
}